

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int float_compare(float left,float right,float epsilon)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar5 = left - right;
  uVar1 = -(uint)(-fVar5 <= fVar5);
  fVar5 = (float)(~uVar1 & (uint)-fVar5 | (uint)fVar5 & uVar1);
  if (epsilon < fVar5) {
    uVar1 = -(uint)(-right <= right);
    uVar2 = -(uint)(-left <= left);
    fVar3 = (float)(~uVar1 & (uint)-right | (uint)right & uVar1);
    fVar4 = (float)(~uVar2 & (uint)-left | (uint)left & uVar2);
    if (fVar3 <= fVar4) {
      fVar3 = fVar4;
    }
    return (int)(fVar5 <= fVar3 * 1.1920929e-07);
  }
  return 1;
}

Assistant:

static int float_compare(const float left,
                         const float right,
                         const float epsilon) {
    float absLeft;
    float absRight;
    float largest;
    float relDiff;

    float diff = left - right;
    diff = (diff >= 0.f) ? diff : -diff;

    // Check if the numbers are really close -- needed
        // when comparing numbers near zero.
        if (diff <= epsilon) {
            return 1;
    }

    absLeft = (left >= 0.f) ? left : -left;
    absRight = (right >= 0.f) ? right : -right;

        largest = (absRight > absLeft) ? absRight : absLeft;
    relDiff = largest * FLT_EPSILON;

        if (diff > relDiff) {
        return 0;
    }
    return 1;
}